

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O3

light_pcapng_stream light_open_stream(char *file_name)

{
  light_pcapng_stream __ptr;
  __fd_t pFVar1;
  
  __ptr = (light_pcapng_stream)calloc(1,0x18);
  pFVar1 = light_open(file_name,LIGHT_OREAD);
  (__ptr->stream).fd = pFVar1;
  if (pFVar1 == (__fd_t)0x0) {
    free(__ptr);
    __ptr = (light_pcapng_stream)0x0;
  }
  else {
    __ptr->valid = 1;
  }
  return __ptr;
}

Assistant:

light_pcapng_stream light_open_stream(const char *file_name)
{
	light_pcapng_stream pcapng = calloc(1, sizeof(struct _light_pcapng_stream));
	pcapng->stream.fd = light_open(file_name, LIGHT_OREAD);

	if (pcapng->stream.fd == NULL) {
		free(pcapng);
		return NULL;
	}

	pcapng->valid = 1;
	return pcapng;
}